

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sectionstyle.cpp
# Opt level: O2

ON_SectionStyle * __thiscall
ON_SectionStyle::operator=(ON_SectionStyle *this,ON_SectionStyle *other)

{
  ON_SectionStylePrivate *pOVar1;
  ON_SectionStylePrivate *this_00;
  
  if (this != other) {
    ON_ModelComponent::operator=(&this->super_ON_ModelComponent,&other->super_ON_ModelComponent);
    pOVar1 = this->m_private;
    if (pOVar1 != (ON_SectionStylePrivate *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&(pOVar1->m_custom_linetype).
                  super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      operator_delete(pOVar1,0x50);
      this->m_private = (ON_SectionStylePrivate *)0x0;
    }
    pOVar1 = other->m_private;
    if (pOVar1 != (ON_SectionStylePrivate *)0x0) {
      this_00 = (ON_SectionStylePrivate *)operator_new(0x50);
      ON_SectionStylePrivate::ON_SectionStylePrivate(this_00,pOVar1);
      this->m_private = this_00;
    }
  }
  return this;
}

Assistant:

ON_SectionStyle& ON_SectionStyle::operator=(const ON_SectionStyle& other)
{
  if (this != &other)
  {
    ON_ModelComponent::operator=(other);
    if (m_private)
    {
      delete m_private;
      m_private = nullptr;
    }
    if (other.m_private)
      m_private = new ON_SectionStylePrivate(*other.m_private);
  }
  return *this;
}